

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

void __thiscall
CustomHeaderOATC::CustomHeaderOATC
          (CustomHeaderOATC *this,vector<CodeGenerator_*,_std::allocator<CodeGenerator_*>_> *gens,
          ProgramContext *program)

{
  ushort uVar1;
  ushort uVar2;
  variant<CompiledLabelDef,_CompiledCommand,_CompiledHex> *pvVar3;
  Command *pCVar4;
  bool bVar5;
  CompiledCommand *pCVar6;
  unsigned_short *puVar7;
  char *msg;
  CompiledData *op;
  variant<CompiledLabelDef,_CompiledCommand,_CompiledHex> *variant;
  pointer ppCVar8;
  unsigned_short local_62;
  Command *local_60;
  undefined1 local_54 [12];
  ProgramContext *local_48;
  pointer local_40;
  Command *local_38;
  
  local_54._4_8_ = &this->ordinal_commands;
  (this->ordinal_commands).
  super__Vector_base<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ordinal_commands).
  super__Vector_base<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ordinal_commands).
  super__Vector_base<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->starting_opcode = 0x1000;
  local_40 = (gens->super__Vector_base<CodeGenerator_*,_std::allocator<CodeGenerator_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_60 = (Command *)this;
  local_48 = program;
  for (ppCVar8 = (gens->super__Vector_base<CodeGenerator_*,_std::allocator<CodeGenerator_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppCVar8 != local_40;
      ppCVar8 = ppCVar8 + 1) {
    pvVar3 = &(((*ppCVar8)->compiled).
               super__Vector_base<CompiledData,_std::allocator<CompiledData>_>._M_impl.
               super__Vector_impl_data._M_finish)->data;
    for (variant = &(((*ppCVar8)->compiled).
                     super__Vector_base<CompiledData,_std::allocator<CompiledData>_>._M_impl.
                     super__Vector_impl_data._M_start)->data; variant != pvVar3;
        variant = variant + 1) {
      bVar5 = is<CompiledCommand,eggs::variants::variant<CompiledLabelDef,CompiledCommand,CompiledHex>>
                        (variant);
      if (bVar5) {
        pCVar6 = eggs::variants::
                 get<CompiledCommand,CompiledLabelDef,CompiledCommand,CompiledHex,1ul>(variant);
        pCVar4 = pCVar6->command;
        if ((pCVar4->hash).super_OptionalBase<unsigned_int>.init_ == true) {
          find_opcode((CustomHeaderOATC *)local_54,local_60);
          if (local_54[0] == '\0') {
            local_62 = (unsigned_short)
                       ((uint)(*(int *)&(local_60->args).super_SmallVectorImpl<Command::Arg>.
                                        super_SmallVectorTemplateBase<Command::Arg,_false>.
                                        super_SmallVectorTemplateCommon<Command::Arg,_void>.
                                        super_SmallVectorBase.BeginX -
                              *(int *)&(((vector<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
                                          *)&local_60->hash)->
                                       super__Vector_base<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 4);
            local_38 = pCVar4;
            std::
            vector<std::pair<Command_const*,unsigned_short>,std::allocator<std::pair<Command_const*,unsigned_short>>>
            ::emplace_back<Command_const*,unsigned_short>
                      ((vector<std::pair<Command_const*,unsigned_short>,std::allocator<std::pair<Command_const*,unsigned_short>>>
                        *)local_54._4_8_,&local_38,&local_62);
          }
        }
        else if ((pCVar4->id).super_OptionalBase<unsigned_short>.init_ == true) {
          uVar1._0_1_ = local_60->supported;
          uVar1._1_1_ = local_60->internal;
          puVar7 = std::experimental::optional<unsigned_short>::operator*(&pCVar4->id);
          if (uVar1 < *puVar7) {
            puVar7 = std::experimental::optional<unsigned_short>::operator*(&pCVar6->command->id);
            *(unsigned_short *)local_60 = *puVar7 + 1;
          }
        }
      }
    }
  }
  uVar2._0_1_ = local_60->supported;
  uVar2._1_1_ = local_60->internal;
  if ((ulong)uVar2 < 0x7fff) {
    if ((ulong)((long)(local_60->args).super_SmallVectorImpl<Command::Arg>.
                      super_SmallVectorTemplateBase<Command::Arg,_false>.
                      super_SmallVectorTemplateCommon<Command::Arg,_void>.super_SmallVectorBase.
                      BeginX -
                (long)(((vector<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
                         *)&local_60->hash)->
                      super__Vector_base<std::pair<const_Command_*,_unsigned_short>,_std::allocator<std::pair<const_Command_*,_unsigned_short>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4) < ((ulong)uVar2 ^ 0x7fff)) {
      return;
    }
    msg = "too many custom commands in a single script";
  }
  else {
    msg = "failed to determine OATC starting opcode";
  }
  ProgramContext::fatal_error<tag_nocontext_t>(local_48,(tag_nocontext_t *)&nocontext,msg);
}

Assistant:

CustomHeaderOATC::CustomHeaderOATC(const std::vector<CodeGenerator*>& gens, ProgramContext& program)
{
    this->starting_opcode = 0x1000;

    for(auto& pgen : gens)
    {
        for(auto& op : pgen->ir())
        {
            if(is<CompiledCommand>(op.data))
            {
                auto& ccmd = get<CompiledCommand>(op.data);
                if(ccmd.command.hash)
                {
                    if(!this->find_opcode(ccmd.command))
                    {
                        this->ordinal_commands.emplace_back(&ccmd.command, (uint16_t) this->ordinal_commands.size());
                    }
                }
                else if(ccmd.command.id && this->starting_opcode < *ccmd.command.id)
                {
                    this->starting_opcode = *ccmd.command.id + 1;
                }
            }
        }
    }

    if(this->starting_opcode >= 0x7FFF)
        program.fatal_error(nocontext, "failed to determine OATC starting opcode");

    if(this->ordinal_commands.size() >= (0x7FFFu - this->starting_opcode))
        program.fatal_error(nocontext, "too many custom commands in a single script");
}